

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTessellationUserDefinedIO.cpp
# Opt level: O1

TestStatus * __thiscall
vkt::tessellation::anon_unknown_1::UserDefinedIOTestInstance::iterate
          (TestStatus *__return_storage_ptr__,UserDefinedIOTestInstance *this)

{
  VkDeviceSize bufferSize;
  void **ppvVar1;
  IOType IVar2;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
  *p_Var3;
  TestLog *log;
  int *piVar4;
  TopLevelObject *pTVar5;
  VkImageSubresourceRange subresourceRange;
  VkImageSubresourceRange subresourceRange_00;
  VkImageSubresourceRange subresourceRange_01;
  undefined8 obj;
  UserDefinedIOTestInstance *pUVar6;
  Allocation *pAVar7;
  bool bVar8;
  deUint32 dVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  InstanceInterface *vki;
  VkPhysicalDevice physDevice;
  DeviceInterface *vk;
  VkDevice device;
  Allocator *allocator;
  TextureFormat TVar14;
  undefined4 extraout_var;
  DescriptorSetLayoutBuilder *this_00;
  DescriptorPoolBuilder *this_01;
  DescriptorSetUpdateBuilder *this_02;
  GraphicsPipelineBuilder *pGVar15;
  const_iterator cVar16;
  pointer pSVar17;
  uint uVar18;
  long lVar19;
  TestStatus *pTVar20;
  long lVar21;
  VkDeviceSize bufferSize_00;
  ulong bufferSize_01;
  VkImageSubresourceLayers subresourceLayers;
  VkExtent3D extent;
  IVec2 renderSize;
  Vec4 clearColor;
  pointer local_508;
  VkAllocationCallbacks *pVStack_500;
  VkCommandBuffer local_4e8;
  long *plStack_4e0;
  VkAccessFlags local_4d8;
  VkAccessFlags VStack_4d4;
  VkImageLayout VStack_4d0;
  VkImageLayout VStack_4cc;
  TestLog *local_4c8;
  int local_4bc;
  TestStatus *local_4b8;
  undefined1 local_4b0 [40];
  long local_488;
  long *plStack_480;
  VkAccessFlags local_478;
  VkAccessFlags VStack_474;
  VkImageLayout VStack_470;
  VkImageLayout VStack_46c;
  key_type local_468;
  key_type local_448;
  VkImageMemoryBarrier colorAttachmentLayoutBarrier;
  ios_base local_3b0 [132];
  deUint32 local_32c;
  bool local_328;
  VkPrimitiveTopology local_324;
  VkRenderPass local_2a8;
  Deleter<vk::Handle<(vk::HandleType)17>_> DStack_2a0;
  VkQueue local_280;
  undefined8 local_278;
  UserDefinedIOTestInstance *local_270;
  VkPipelineLayout local_268;
  Deleter<vk::Handle<(vk::HandleType)16>_> DStack_260;
  VkDescriptorSetLayout local_248;
  Deleter<vk::Handle<(vk::HandleType)19>_> DStack_240;
  key_type local_228;
  Image colorAttachmentImage;
  Deleter<vk::Handle<(vk::HandleType)18>_> DStack_180;
  VkCommandPool local_168;
  Deleter<vk::Handle<(vk::HandleType)24>_> DStack_160;
  VkFramebuffer local_148;
  Deleter<vk::Handle<(vk::HandleType)23>_> DStack_140;
  VkImageView local_128;
  Deleter<vk::Handle<(vk::HandleType)13>_> DStack_120;
  VkDescriptorPool local_108;
  Deleter<vk::Handle<(vk::HandleType)21>_> DStack_100;
  Buffer colorBuffer;
  Buffer resultBuffer;
  VkDescriptorBufferInfo resultBufferInfo;
  Buffer vertexBuffer;
  
  local_4b8 = __return_storage_ptr__;
  vki = Context::getInstanceInterface((this->super_TestInstance).m_context);
  physDevice = Context::getPhysicalDevice((this->super_TestInstance).m_context);
  requireFeatures(vki,physDevice,9);
  vk = Context::getDeviceInterface((this->super_TestInstance).m_context);
  device = Context::getDevice((this->super_TestInstance).m_context);
  local_280 = Context::getUniversalQueue((this->super_TestInstance).m_context);
  dVar9 = Context::getUniversalQueueFamilyIndex((this->super_TestInstance).m_context);
  local_4c8 = (TestLog *)CONCAT44(local_4c8._4_4_,dVar9);
  allocator = Context::getDefaultAllocator((this->super_TestInstance).m_context);
  iVar10 = referenceVertexCount
                     ((this->m_caseDef).primitiveType,SPACINGMODE_EQUAL,false,iterate::attributes,
                      iterate::attributes + 2);
  local_270 = this;
  local_4bc = referenceVertexCount
                        ((this->m_caseDef).primitiveType,SPACINGMODE_EQUAL,true,iterate::attributes,
                         iterate::attributes + 2);
  TVar14 = ::vk::mapVkFormat(VK_FORMAT_R32_SFLOAT);
  iVar11 = tcu::getPixelSize(TVar14);
  local_278 = CONCAT44(extraout_var,iVar11);
  bufferSize_01 = (ulong)(uint)(iVar11 * 10);
  makeBufferCreateInfo((VkBufferCreateInfo *)&colorAttachmentLayoutBarrier,bufferSize_01,0x80);
  tessellation::Buffer::Buffer
            (&vertexBuffer,vk,device,allocator,(VkBufferCreateInfo *)&colorAttachmentLayoutBarrier,
             (MemoryRequirement)0x1);
  pAVar7 = vertexBuffer.m_allocation.
           super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr;
  memcpy((vertexBuffer.m_allocation.
          super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr)->
         m_hostPtr,iterate::attributes,bufferSize_01);
  ::vk::flushMappedMemoryRange
            (vk,device,(VkDeviceMemory)(pAVar7->m_memory).m_internal,pAVar7->m_offset,bufferSize_01)
  ;
  bufferSize = (long)iVar10 * 4 + 4;
  makeBufferCreateInfo((VkBufferCreateInfo *)&colorAttachmentLayoutBarrier,bufferSize,0x20);
  tessellation::Buffer::Buffer
            (&resultBuffer,vk,device,allocator,(VkBufferCreateInfo *)&colorAttachmentLayoutBarrier,
             (MemoryRequirement)0x1);
  pAVar7 = resultBuffer.m_allocation.
           super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr;
  memset((resultBuffer.m_allocation.
          super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr)->
         m_hostPtr,0,bufferSize);
  ::vk::flushMappedMemoryRange
            (vk,device,(VkDeviceMemory)(pAVar7->m_memory).m_internal,pAVar7->m_offset,bufferSize);
  pUVar6 = local_270;
  renderSize.m_data[0] = 0x100;
  renderSize.m_data[1] = 0x100;
  makeImageCreateInfo((VkImageCreateInfo *)&colorAttachmentLayoutBarrier,&renderSize,
                      VK_FORMAT_R8G8B8A8_UNORM,0x11,1);
  Image::Image(&colorAttachmentImage,vk,device,allocator,
               (VkImageCreateInfo *)&colorAttachmentLayoutBarrier,(MemoryRequirement)0x0);
  iVar11 = renderSize.m_data[1] * renderSize.m_data[0];
  TVar14 = ::vk::mapVkFormat(VK_FORMAT_R8G8B8A8_UNORM);
  iVar10 = tcu::getPixelSize(TVar14);
  bufferSize_00 = (VkDeviceSize)(iVar11 * iVar10);
  makeBufferCreateInfo((VkBufferCreateInfo *)&colorAttachmentLayoutBarrier,bufferSize_00,2);
  tessellation::Buffer::Buffer
            (&colorBuffer,vk,device,allocator,(VkBufferCreateInfo *)&colorAttachmentLayoutBarrier,
             (MemoryRequirement)0x1);
  ::vk::DescriptorSetLayoutBuilder::DescriptorSetLayoutBuilder
            ((DescriptorSetLayoutBuilder *)&colorAttachmentLayoutBarrier);
  this_00 = ::vk::DescriptorSetLayoutBuilder::addBinding
                      ((DescriptorSetLayoutBuilder *)&colorAttachmentLayoutBarrier,
                       VK_DESCRIPTOR_TYPE_STORAGE_BUFFER,1,4,(VkSampler *)0x0);
  ::vk::DescriptorSetLayoutBuilder::build
            ((Move<vk::Handle<(vk::HandleType)19>_> *)&clearColor,this_00,vk,device,0);
  DStack_240.m_device = (VkDevice)local_508;
  DStack_240.m_allocator = pVStack_500;
  local_248.m_internal._0_4_ = clearColor.m_data[0];
  local_248.m_internal._4_4_ = clearColor.m_data[1];
  DStack_240.m_deviceIface = (DeviceInterface *)clearColor.m_data._8_8_;
  clearColor.m_data[0] = 0.0;
  clearColor.m_data[1] = 0.0;
  clearColor.m_data[2] = 0.0;
  clearColor.m_data[3] = 0.0;
  local_508 = (pointer)0x0;
  pVStack_500 = (VkAllocationCallbacks *)0x0;
  if (colorAttachmentLayoutBarrier.subresourceRange._0_8_ != 0) {
    operator_delete((void *)colorAttachmentLayoutBarrier.subresourceRange._0_8_,
                    colorAttachmentLayoutBarrier._64_8_ -
                    colorAttachmentLayoutBarrier.subresourceRange._0_8_);
  }
  if (colorAttachmentLayoutBarrier._24_8_ != 0) {
    operator_delete((void *)colorAttachmentLayoutBarrier._24_8_,
                    colorAttachmentLayoutBarrier.image.m_internal -
                    colorAttachmentLayoutBarrier._24_8_);
  }
  if (colorAttachmentLayoutBarrier._0_8_ != 0) {
    operator_delete((void *)colorAttachmentLayoutBarrier._0_8_,
                    colorAttachmentLayoutBarrier._16_8_ - colorAttachmentLayoutBarrier._0_8_);
  }
  ::vk::DescriptorPoolBuilder::DescriptorPoolBuilder((DescriptorPoolBuilder *)&clearColor);
  this_01 = ::vk::DescriptorPoolBuilder::addType
                      ((DescriptorPoolBuilder *)&clearColor,VK_DESCRIPTOR_TYPE_STORAGE_BUFFER,1);
  ::vk::DescriptorPoolBuilder::build
            ((Move<vk::Handle<(vk::HandleType)21>_> *)&colorAttachmentLayoutBarrier,this_01,vk,
             device,1,1);
  DStack_100.m_device = (VkDevice)colorAttachmentLayoutBarrier._16_8_;
  DStack_100.m_allocator = (VkAllocationCallbacks *)colorAttachmentLayoutBarrier._24_8_;
  local_108.m_internal = colorAttachmentLayoutBarrier._0_8_;
  DStack_100.m_deviceIface = (DeviceInterface *)colorAttachmentLayoutBarrier.pNext;
  colorAttachmentLayoutBarrier.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  colorAttachmentLayoutBarrier._4_4_ = 0;
  colorAttachmentLayoutBarrier.pNext = (void *)0x0;
  colorAttachmentLayoutBarrier.srcAccessMask = 0;
  colorAttachmentLayoutBarrier.dstAccessMask = 0;
  colorAttachmentLayoutBarrier.oldLayout = VK_IMAGE_LAYOUT_UNDEFINED;
  colorAttachmentLayoutBarrier.newLayout = VK_IMAGE_LAYOUT_UNDEFINED;
  if (clearColor.m_data._0_8_ != 0) {
    operator_delete((void *)clearColor.m_data._0_8_,(long)local_508 - clearColor.m_data._0_8_);
  }
  makeDescriptorSet((Move<vk::Handle<(vk::HandleType)22>_> *)&colorAttachmentLayoutBarrier,vk,device
                    ,local_108,local_248);
  local_478 = colorAttachmentLayoutBarrier.srcAccessMask;
  VStack_474 = colorAttachmentLayoutBarrier.dstAccessMask;
  VStack_470 = colorAttachmentLayoutBarrier.oldLayout;
  VStack_46c = colorAttachmentLayoutBarrier.newLayout;
  local_488 = colorAttachmentLayoutBarrier._0_8_;
  plStack_480 = (long *)colorAttachmentLayoutBarrier.pNext;
  ::vk::DescriptorSetUpdateBuilder::DescriptorSetUpdateBuilder
            ((DescriptorSetUpdateBuilder *)&colorAttachmentLayoutBarrier);
  this_02 = (DescriptorSetUpdateBuilder *)
            ::vk::DescriptorSetUpdateBuilder::write
                      ((DescriptorSetUpdateBuilder *)&colorAttachmentLayoutBarrier,(int)local_488,
                       (void *)0x0,0);
  ::vk::DescriptorSetUpdateBuilder::update(this_02,vk,device);
  if (colorAttachmentLayoutBarrier.subresourceRange._0_8_ != 0) {
    operator_delete((void *)colorAttachmentLayoutBarrier.subresourceRange._0_8_,
                    colorAttachmentLayoutBarrier._64_8_ -
                    colorAttachmentLayoutBarrier.subresourceRange._0_8_);
  }
  if (colorAttachmentLayoutBarrier._24_8_ != 0) {
    operator_delete((void *)colorAttachmentLayoutBarrier._24_8_,
                    colorAttachmentLayoutBarrier.image.m_internal -
                    colorAttachmentLayoutBarrier._24_8_);
  }
  std::
  vector<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo,_std::allocator<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo>_>
  ::~vector((vector<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo,_std::allocator<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo>_>
             *)&colorAttachmentLayoutBarrier);
  subresourceRange.levelCount = 1;
  subresourceRange.baseArrayLayer = 0;
  subresourceRange.aspectMask = 1;
  subresourceRange.baseMipLevel = 0;
  subresourceRange.layerCount = 1;
  makeImageView((Move<vk::Handle<(vk::HandleType)13>_> *)&colorAttachmentLayoutBarrier,vk,device,
                (VkImage)colorAttachmentImage.m_image.super_RefBase<vk::Handle<(vk::HandleType)9>_>.
                         m_data.object.m_internal,VK_IMAGE_VIEW_TYPE_2D,VK_FORMAT_R8G8B8A8_UNORM,
                subresourceRange);
  DStack_120.m_device = (VkDevice)colorAttachmentLayoutBarrier._16_8_;
  DStack_120.m_allocator = (VkAllocationCallbacks *)colorAttachmentLayoutBarrier._24_8_;
  local_128.m_internal = colorAttachmentLayoutBarrier._0_8_;
  DStack_120.m_deviceIface = (DeviceInterface *)colorAttachmentLayoutBarrier.pNext;
  makeRenderPass((Move<vk::Handle<(vk::HandleType)17>_> *)&colorAttachmentLayoutBarrier,vk,device,
                 VK_FORMAT_R8G8B8A8_UNORM);
  DStack_2a0.m_device = (VkDevice)colorAttachmentLayoutBarrier._16_8_;
  DStack_2a0.m_allocator = (VkAllocationCallbacks *)colorAttachmentLayoutBarrier._24_8_;
  local_2a8.m_internal = colorAttachmentLayoutBarrier._0_8_;
  DStack_2a0.m_deviceIface = (DeviceInterface *)colorAttachmentLayoutBarrier.pNext;
  makeFramebuffer((Move<vk::Handle<(vk::HandleType)23>_> *)&colorAttachmentLayoutBarrier,vk,device,
                  (VkRenderPass)colorAttachmentLayoutBarrier._0_8_,local_128,renderSize.m_data[0],
                  renderSize.m_data[1],1);
  DStack_140.m_device = (VkDevice)colorAttachmentLayoutBarrier._16_8_;
  DStack_140.m_allocator = (VkAllocationCallbacks *)colorAttachmentLayoutBarrier._24_8_;
  local_148.m_internal = colorAttachmentLayoutBarrier._0_8_;
  DStack_140.m_deviceIface = (DeviceInterface *)colorAttachmentLayoutBarrier.pNext;
  makePipelineLayout((Move<vk::Handle<(vk::HandleType)16>_> *)&colorAttachmentLayoutBarrier,vk,
                     device,local_248);
  DStack_260.m_device = (VkDevice)colorAttachmentLayoutBarrier._16_8_;
  DStack_260.m_allocator = (VkAllocationCallbacks *)colorAttachmentLayoutBarrier._24_8_;
  local_268.m_internal = colorAttachmentLayoutBarrier._0_8_;
  DStack_260.m_deviceIface = (DeviceInterface *)colorAttachmentLayoutBarrier.pNext;
  makeCommandPool((Move<vk::Handle<(vk::HandleType)24>_> *)&colorAttachmentLayoutBarrier,vk,device,
                  (deUint32)local_4c8);
  DStack_160.m_device = (VkDevice)colorAttachmentLayoutBarrier._16_8_;
  DStack_160.m_allocator = (VkAllocationCallbacks *)colorAttachmentLayoutBarrier._24_8_;
  local_168.m_internal = colorAttachmentLayoutBarrier._0_8_;
  DStack_160.m_deviceIface = (DeviceInterface *)colorAttachmentLayoutBarrier.pNext;
  ::vk::allocateCommandBuffer
            ((Move<vk::VkCommandBuffer_s_*> *)&colorAttachmentLayoutBarrier,vk,device,
             (VkCommandPool)colorAttachmentLayoutBarrier._0_8_,VK_COMMAND_BUFFER_LEVEL_PRIMARY);
  local_4d8 = colorAttachmentLayoutBarrier.srcAccessMask;
  VStack_4d4 = colorAttachmentLayoutBarrier.dstAccessMask;
  VStack_4d0 = colorAttachmentLayoutBarrier.oldLayout;
  VStack_4cc = colorAttachmentLayoutBarrier.newLayout;
  local_4e8 = (VkCommandBuffer)colorAttachmentLayoutBarrier._0_8_;
  plStack_4e0 = (long *)colorAttachmentLayoutBarrier.pNext;
  memset((GraphicsPipelineBuilder *)&colorAttachmentLayoutBarrier,0,0xfc);
  local_328 = false;
  local_324 = VK_PRIMITIVE_TOPOLOGY_TRIANGLE_LIST;
  colorAttachmentLayoutBarrier.sType = renderSize.m_data[0];
  colorAttachmentLayoutBarrier._4_4_ = renderSize.m_data[1];
  local_32c = 10;
  pGVar15 = GraphicsPipelineBuilder::setVertexInputSingleAttribute
                      ((GraphicsPipelineBuilder *)&colorAttachmentLayoutBarrier,VK_FORMAT_R32_SFLOAT
                       ,(deUint32)local_278);
  p_Var3 = (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
            *)((pUVar6->super_TestInstance).m_context)->m_progCollection;
  local_4b0._0_8_ = (long)local_4b0 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_4b0,"vert","");
  cVar16 = std::
           _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
           ::find(p_Var3,(key_type *)local_4b0);
  pGVar15 = GraphicsPipelineBuilder::setShader
                      (pGVar15,vk,device,VK_SHADER_STAGE_VERTEX_BIT,
                       *(ProgramBinary **)(cVar16._M_node + 2),(VkSpecializationInfo *)0x0);
  p_Var3 = (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
            *)((pUVar6->super_TestInstance).m_context)->m_progCollection;
  local_448._M_dataplus._M_p = (pointer)&local_448.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_448,"tesc","");
  cVar16 = std::
           _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
           ::find(p_Var3,&local_448);
  pGVar15 = GraphicsPipelineBuilder::setShader
                      (pGVar15,vk,device,VK_SHADER_STAGE_TESSELLATION_CONTROL_BIT,
                       *(ProgramBinary **)(cVar16._M_node + 2),(VkSpecializationInfo *)0x0);
  p_Var3 = (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
            *)((pUVar6->super_TestInstance).m_context)->m_progCollection;
  local_468._M_dataplus._M_p = (pointer)&local_468.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_468,"tese","");
  cVar16 = std::
           _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
           ::find(p_Var3,&local_468);
  pGVar15 = GraphicsPipelineBuilder::setShader
                      (pGVar15,vk,device,VK_SHADER_STAGE_TESSELLATION_EVALUATION_BIT,
                       *(ProgramBinary **)(cVar16._M_node + 2),(VkSpecializationInfo *)0x0);
  p_Var3 = (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
            *)((pUVar6->super_TestInstance).m_context)->m_progCollection;
  local_228._M_dataplus._M_p = (pointer)&local_228.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_228,"frag","");
  cVar16 = std::
           _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
           ::find(p_Var3,&local_228);
  pGVar15 = GraphicsPipelineBuilder::setShader
                      (pGVar15,vk,device,VK_SHADER_STAGE_FRAGMENT_BIT,
                       *(ProgramBinary **)(cVar16._M_node + 2),(VkSpecializationInfo *)0x0);
  GraphicsPipelineBuilder::build
            ((Move<vk::Handle<(vk::HandleType)18>_> *)&clearColor,pGVar15,vk,device,local_268,
             local_2a8);
  obj = clearColor.m_data._0_8_;
  DStack_180.m_device = (VkDevice)local_508;
  DStack_180.m_allocator = pVStack_500;
  DStack_180.m_deviceIface = (DeviceInterface *)clearColor.m_data._8_8_;
  clearColor.m_data[0] = 0.0;
  clearColor.m_data[1] = 0.0;
  clearColor.m_data[2] = 0.0;
  clearColor.m_data[3] = 0.0;
  local_508 = (pointer)0x0;
  pVStack_500 = (VkAllocationCallbacks *)0x0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_228._M_dataplus._M_p != &local_228.field_2) {
    operator_delete(local_228._M_dataplus._M_p,local_228.field_2._M_allocated_capacity + 1);
  }
  iVar10 = local_4bc;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_468._M_dataplus._M_p != &local_468.field_2) {
    operator_delete(local_468._M_dataplus._M_p,local_468.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_448._M_dataplus._M_p != &local_448.field_2) {
    operator_delete(local_448._M_dataplus._M_p,local_448.field_2._M_allocated_capacity + 1);
  }
  if (local_4b0._0_8_ != (long)local_4b0 + 0x10) {
    operator_delete((void *)local_4b0._0_8_,local_4b0._16_8_ + 1);
  }
  GraphicsPipelineBuilder::~GraphicsPipelineBuilder
            ((GraphicsPipelineBuilder *)&colorAttachmentLayoutBarrier);
  beginCommandBuffer(vk,local_4e8);
  subresourceRange_00.levelCount = 1;
  subresourceRange_00.baseArrayLayer = 0;
  subresourceRange_00.aspectMask = 1;
  subresourceRange_00.baseMipLevel = 0;
  subresourceRange_00.layerCount = 1;
  makeImageMemoryBarrier
            (&colorAttachmentLayoutBarrier,0,0x100,VK_IMAGE_LAYOUT_UNDEFINED,
             VK_IMAGE_LAYOUT_COLOR_ATTACHMENT_OPTIMAL,
             (VkImage)colorAttachmentImage.m_image.super_RefBase<vk::Handle<(vk::HandleType)9>_>.
                      m_data.object.m_internal,subresourceRange_00);
  (*vk->_vptr_DeviceInterface[0x6d])
            (vk,local_4e8,1,0x80,0,0,0,0,0,1,(int)&colorAttachmentLayoutBarrier);
  colorAttachmentLayoutBarrier.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  colorAttachmentLayoutBarrier._4_4_ = 0;
  colorAttachmentLayoutBarrier.pNext = (void *)renderSize.m_data;
  clearColor.m_data[0] = 0.0;
  clearColor.m_data[1] = 0.0;
  clearColor.m_data[2] = 0.0;
  clearColor.m_data[3] = 1.0;
  beginRenderPass(vk,local_4e8,local_2a8,local_148,(VkRect2D *)&colorAttachmentLayoutBarrier,
                  &clearColor);
  (*vk->_vptr_DeviceInterface[0x4c])(vk,local_4e8,0,obj);
  (*vk->_vptr_DeviceInterface[0x56])(vk,local_4e8,0,local_268.m_internal,0,1,&local_488,0,0);
  colorAttachmentLayoutBarrier.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  colorAttachmentLayoutBarrier._4_4_ = 0;
  (*vk->_vptr_DeviceInterface[0x58])(vk,local_4e8,0,1,&vertexBuffer);
  (*vk->_vptr_DeviceInterface[0x59])(vk,local_4e8,10,1,0,0);
  endRenderPass(vk,local_4e8);
  subresourceRange_01.levelCount = 1;
  subresourceRange_01.baseArrayLayer = 0;
  subresourceRange_01.aspectMask = 1;
  subresourceRange_01.baseMipLevel = 0;
  subresourceRange_01.layerCount = 1;
  makeImageMemoryBarrier
            (&colorAttachmentLayoutBarrier,0x100,0x800,VK_IMAGE_LAYOUT_COLOR_ATTACHMENT_OPTIMAL,
             VK_IMAGE_LAYOUT_TRANSFER_SRC_OPTIMAL,
             (VkImage)colorAttachmentImage.m_image.super_RefBase<vk::Handle<(vk::HandleType)9>_>.
                      m_data.object.m_internal,subresourceRange_01);
  (*vk->_vptr_DeviceInterface[0x6d])
            (vk,local_4e8,0x400,0x1000,0,0,0,0,0,1,(int)&colorAttachmentLayoutBarrier);
  subresourceLayers.baseArrayLayer = 0;
  subresourceLayers.layerCount = 1;
  subresourceLayers.aspectMask = 1;
  subresourceLayers.mipLevel = 0;
  extent.depth = 1;
  extent.width = renderSize.m_data[0];
  extent.height = renderSize.m_data[1];
  makeBufferImageCopy((VkBufferImageCopy *)&colorAttachmentLayoutBarrier,extent,subresourceLayers);
  (*vk->_vptr_DeviceInterface[99])
            (vk,local_4e8,
             colorAttachmentImage.m_image.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.
             object.m_internal,6,
             colorBuffer.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.
             m_internal,1,(int)&colorAttachmentLayoutBarrier);
  makeBufferMemoryBarrier
            ((VkBufferMemoryBarrier *)&colorAttachmentLayoutBarrier,0x1000,0x2000,
             (VkBuffer)
             colorBuffer.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.
             m_internal,0,bufferSize_00);
  (*vk->_vptr_DeviceInterface[0x6d])
            (vk,local_4e8,0x1000,0x4000,0,0,0,1,&colorAttachmentLayoutBarrier,0,0);
  endCommandBuffer(vk,local_4e8);
  submitCommandsAndWait(vk,device,local_280,local_4e8);
  pAVar7 = colorBuffer.m_allocation.
           super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr;
  ::vk::invalidateMappedMemoryRange
            (vk,device,
             (VkDeviceMemory)
             ((colorBuffer.m_allocation.
               super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr)->
             m_memory).m_internal,
             (colorBuffer.m_allocation.
              super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr)->
             m_offset,bufferSize_00);
  tcu::TextureLevel::TextureLevel((TextureLevel *)&colorAttachmentLayoutBarrier);
  tcu::ImageIO::loadPNG
            ((TextureLevel *)&colorAttachmentLayoutBarrier,
             ((pUVar6->super_TestInstance).m_context)->m_testCtx->m_curArchive,
             (pUVar6->m_caseDef).referenceImagePath._M_dataplus._M_p);
  local_4b0._0_8_ = ::vk::mapVkFormat(VK_FORMAT_R8G8B8A8_UNORM);
  tcu::ConstPixelBufferAccess::ConstPixelBufferAccess
            ((ConstPixelBufferAccess *)&clearColor,(TextureFormat *)local_4b0,renderSize.m_data[0],
             renderSize.m_data[1],1,pAVar7->m_hostPtr);
  log = ((pUVar6->super_TestInstance).m_context)->m_testCtx->m_log;
  tcu::TextureLevel::getAccess
            ((PixelBufferAccess *)local_4b0,(TextureLevel *)&colorAttachmentLayoutBarrier);
  bVar8 = tcu::fuzzyCompare(log,"ImageComparison","Image Comparison",
                            (ConstPixelBufferAccess *)local_4b0,
                            (ConstPixelBufferAccess *)&clearColor,0.02,COMPARE_LOG_RESULT);
  tcu::TextureLevel::~TextureLevel((TextureLevel *)&colorAttachmentLayoutBarrier);
  pAVar7 = resultBuffer.m_allocation.
           super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr;
  ::vk::invalidateMappedMemoryRange
            (vk,device,
             (VkDeviceMemory)
             ((resultBuffer.m_allocation.
               super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr)->
             m_memory).m_internal,
             (resultBuffer.m_allocation.
              super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr)->
             m_offset,bufferSize);
  piVar4 = (int *)pAVar7->m_hostPtr;
  iVar11 = *piVar4;
  if (iVar11 < iVar10) {
    colorAttachmentLayoutBarrier._0_8_ = ((pUVar6->super_TestInstance).m_context)->m_testCtx->m_log;
    ppvVar1 = &colorAttachmentLayoutBarrier.pNext;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)ppvVar1);
    pTVar20 = local_4b8;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)ppvVar1,"Failure: got ",0xd);
    std::ostream::operator<<(ppvVar1,iVar11);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)ppvVar1," vertices, but expected at least ",0x21);
    std::ostream::operator<<(ppvVar1,iVar10);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)&colorAttachmentLayoutBarrier,
               (EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)ppvVar1);
    std::ios_base::~ios_base(local_3b0);
    colorAttachmentLayoutBarrier._0_8_ = &colorAttachmentLayoutBarrier.srcAccessMask;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&colorAttachmentLayoutBarrier,"Wrong number of vertices","");
    pTVar20->m_code = QP_TEST_RESULT_FAIL;
    (pTVar20->m_description)._M_dataplus._M_p = (pointer)&(pTVar20->m_description).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&pTVar20->m_description,colorAttachmentLayoutBarrier._0_8_,
               (long)colorAttachmentLayoutBarrier.pNext + colorAttachmentLayoutBarrier._0_8_);
  }
  else {
    IVar2 = (pUVar6->m_caseDef).ioType;
    if ((ulong)IVar2 < 3) {
      uVar18 = *(uint *)(&DAT_00b787a4 + (ulong)IVar2 * 4);
    }
    else {
      uVar18 = (uint)(IVar2 != IO_TYPE_PER_PATCH_BLOCK_ARRAY) * 3 + 2;
    }
    local_4c8 = ((pUVar6->super_TestInstance).m_context)->m_testCtx->m_log;
    pSVar17 = (pUVar6->m_tesInputs).
              super__Vector_base<de::SharedPtr<vkt::tessellation::(anonymous_namespace)::TopLevelObject>,_std::allocator<de::SharedPtr<vkt::tessellation::(anonymous_namespace)::TopLevelObject>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    if ((int)((ulong)((long)(pUVar6->m_tesInputs).
                            super__Vector_base<de::SharedPtr<vkt::tessellation::(anonymous_namespace)::TopLevelObject>,_std::allocator<de::SharedPtr<vkt::tessellation::(anonymous_namespace)::TopLevelObject>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)pSVar17) >> 4) < 1) {
      iVar10 = 0;
    }
    else {
      lVar21 = 0;
      lVar19 = 0;
      iVar10 = 0;
      do {
        iVar12 = (**(code **)(**(long **)((long)&pSVar17->m_ptr + lVar21) + 0x38))();
        iVar10 = iVar10 + iVar12;
        lVar19 = lVar19 + 1;
        pSVar17 = (pUVar6->m_tesInputs).
                  super__Vector_base<de::SharedPtr<vkt::tessellation::(anonymous_namespace)::TopLevelObject>,_std::allocator<de::SharedPtr<vkt::tessellation::(anonymous_namespace)::TopLevelObject>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        lVar21 = lVar21 + 0x10;
      } while (lVar19 < (int)((ulong)((long)(pUVar6->m_tesInputs).
                                            super__Vector_base<de::SharedPtr<vkt::tessellation::(anonymous_namespace)::TopLevelObject>,_std::allocator<de::SharedPtr<vkt::tessellation::(anonymous_namespace)::TopLevelObject>_>_>
                                            ._M_impl.super__Vector_impl_data._M_finish -
                                     (long)pSVar17) >> 4));
    }
    pTVar20 = local_4b8;
    if (0 < iVar11) {
      lVar19 = 0;
      do {
        if (iVar10 * uVar18 < (uint)piVar4[lVar19 + 1]) {
          ppvVar1 = &colorAttachmentLayoutBarrier.pNext;
          colorAttachmentLayoutBarrier._0_8_ = local_4c8;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)ppvVar1);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)ppvVar1,"Failure: out_te_firstFailedInputIndex has value ",0x30);
          std::ostream::_M_insert<unsigned_long>((ulong)ppvVar1);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)ppvVar1,", but should be in range [0, ",0x1d);
          std::ostream::_M_insert<unsigned_long>((ulong)ppvVar1);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)ppvVar1,"]",1);
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)&colorAttachmentLayoutBarrier,
                     (EndMessageToken *)&tcu::TestLog::EndMessage);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)ppvVar1);
          std::ios_base::~ios_base(local_3b0);
          colorAttachmentLayoutBarrier._0_8_ = &colorAttachmentLayoutBarrier.srcAccessMask;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&colorAttachmentLayoutBarrier,"Invalid values returned from shader",
                     "");
          pTVar20->m_code = QP_TEST_RESULT_FAIL;
          (pTVar20->m_description)._M_dataplus._M_p = (pointer)&(pTVar20->m_description).field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&pTVar20->m_description,colorAttachmentLayoutBarrier._0_8_,
                     (long)colorAttachmentLayoutBarrier.pNext + colorAttachmentLayoutBarrier._0_8_);
          goto LAB_007cda00;
        }
        if (piVar4[lVar19 + 1] != iVar10 * uVar18) {
          ppvVar1 = &colorAttachmentLayoutBarrier.pNext;
          colorAttachmentLayoutBarrier._0_8_ = local_4c8;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)ppvVar1);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)ppvVar1,
                     "Failure: in tessellation evaluation shader, check for input ",0x3c);
          iVar10 = piVar4[lVar19 + 1];
          if (iVar10 < 1) {
            iVar11 = 0;
            iVar12 = 0;
          }
          else {
            iVar12 = 0;
            iVar11 = 0;
            do {
              iVar13 = (*((pUVar6->m_tesInputs).
                          super__Vector_base<de::SharedPtr<vkt::tessellation::(anonymous_namespace)::TopLevelObject>,_std::allocator<de::SharedPtr<vkt::tessellation::(anonymous_namespace)::TopLevelObject>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[iVar12].m_ptr)->
                         _vptr_TopLevelObject[7])();
              iVar11 = iVar11 + iVar13 * uVar18;
              iVar12 = iVar12 + 1;
            } while (iVar11 < iVar10);
          }
          if (iVar10 < iVar11) {
            iVar12 = iVar12 + -1;
            iVar13 = (*((pUVar6->m_tesInputs).
                        super__Vector_base<de::SharedPtr<vkt::tessellation::(anonymous_namespace)::TopLevelObject>,_std::allocator<de::SharedPtr<vkt::tessellation::(anonymous_namespace)::TopLevelObject>_>_>
                        ._M_impl.super__Vector_impl_data._M_start[iVar12].m_ptr)->
                       _vptr_TopLevelObject[7])();
            iVar11 = iVar11 - iVar13 * uVar18;
          }
          pTVar5 = (pUVar6->m_tesInputs).
                   super__Vector_base<de::SharedPtr<vkt::tessellation::(anonymous_namespace)::TopLevelObject>,_std::allocator<de::SharedPtr<vkt::tessellation::(anonymous_namespace)::TopLevelObject>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[iVar12].m_ptr;
          (*pTVar5->_vptr_TopLevelObject[8])
                    (&clearColor,pTVar5,(ulong)(uint)(iVar10 - iVar11),(ulong)uVar18);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)ppvVar1,(char *)clearColor.m_data._0_8_,clearColor.m_data._8_8_);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)ppvVar1," failed",7);
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)&colorAttachmentLayoutBarrier,
                     (EndMessageToken *)&tcu::TestLog::EndMessage);
          if ((pointer *)clearColor.m_data._0_8_ != &local_508) {
            operator_delete((void *)clearColor.m_data._0_8_,(ulong)((long)&local_508->type + 1));
          }
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)ppvVar1);
          std::ios_base::~ios_base(local_3b0);
          colorAttachmentLayoutBarrier._0_8_ = &colorAttachmentLayoutBarrier.srcAccessMask;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&colorAttachmentLayoutBarrier,
                     "Invalid input value in tessellation evaluation shader","");
          pTVar20->m_code = QP_TEST_RESULT_FAIL;
          (pTVar20->m_description)._M_dataplus._M_p = (pointer)&(pTVar20->m_description).field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&pTVar20->m_description,colorAttachmentLayoutBarrier._0_8_,
                     (long)colorAttachmentLayoutBarrier.pNext + colorAttachmentLayoutBarrier._0_8_);
          goto LAB_007cda00;
        }
        lVar19 = lVar19 + 1;
      } while (iVar11 != (int)lVar19);
    }
    colorAttachmentLayoutBarrier._0_8_ = &colorAttachmentLayoutBarrier.srcAccessMask;
    if (bVar8) {
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&colorAttachmentLayoutBarrier,"OK","");
      pTVar20->m_code = QP_TEST_RESULT_PASS;
      (pTVar20->m_description)._M_dataplus._M_p = (pointer)&(pTVar20->m_description).field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&pTVar20->m_description,colorAttachmentLayoutBarrier._0_8_,
                 (long)colorAttachmentLayoutBarrier.pNext + colorAttachmentLayoutBarrier._0_8_);
    }
    else {
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&colorAttachmentLayoutBarrier,"Image comparison failed","");
      pTVar20->m_code = QP_TEST_RESULT_FAIL;
      (pTVar20->m_description)._M_dataplus._M_p = (pointer)&(pTVar20->m_description).field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&pTVar20->m_description,colorAttachmentLayoutBarrier._0_8_,
                 (long)colorAttachmentLayoutBarrier.pNext + colorAttachmentLayoutBarrier._0_8_);
    }
  }
LAB_007cda00:
  if ((VkAccessFlags *)colorAttachmentLayoutBarrier._0_8_ !=
      &colorAttachmentLayoutBarrier.srcAccessMask) {
    operator_delete((void *)colorAttachmentLayoutBarrier._0_8_,
                    colorAttachmentLayoutBarrier._16_8_ + 1);
  }
  if (obj != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)18>_>::operator()
              (&DStack_180,(VkPipeline)obj);
  }
  if (local_4e8 != (VkCommandBuffer)0x0) {
    clearColor.m_data._0_8_ = local_4e8;
    (**(code **)(*plStack_4e0 + 0x240))(plStack_4e0,_local_4d8,_VStack_4d0,1);
  }
  if (local_168.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)24>_>::operator()(&DStack_160,local_168);
  }
  if (local_268.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)16>_>::operator()(&DStack_260,local_268);
  }
  if (local_148.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)23>_>::operator()(&DStack_140,local_148);
  }
  if (local_2a8.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)17>_>::operator()(&DStack_2a0,local_2a8);
  }
  if (local_128.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)13>_>::operator()(&DStack_120,local_128);
  }
  if (local_488 != 0) {
    clearColor.m_data[0] = (float)(undefined4)local_488;
    clearColor.m_data[1] = (float)local_488._4_4_;
    (**(code **)(*plStack_480 + 0x1e8))(plStack_480,_local_478,_VStack_470,1);
  }
  if (local_108.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)21>_>::operator()(&DStack_100,local_108);
  }
  if (local_248.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)19>_>::operator()(&DStack_240,local_248);
  }
  if (colorBuffer.m_allocation.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>
      .m_data.ptr != (Allocation *)0x0) {
    (*(colorBuffer.m_allocation.
       super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr)->
      _vptr_Allocation[1])();
    colorBuffer.m_allocation.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.
    m_data.ptr = (Allocation *)0x0;
  }
  if (colorBuffer.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal !=
      0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)8>_>::operator()
              (&colorBuffer.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter,
               (VkBuffer)
               colorBuffer.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.
               m_internal);
  }
  if (colorAttachmentImage.m_allocation.
      super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr !=
      (Allocation *)0x0) {
    (*(colorAttachmentImage.m_allocation.
       super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr)->
      _vptr_Allocation[1])();
    colorAttachmentImage.m_allocation.
    super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr =
         (Allocation *)0x0;
  }
  if (colorAttachmentImage.m_image.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.
      m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)9>_>::operator()
              (&colorAttachmentImage.m_image.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.
                deleter,(VkImage)colorAttachmentImage.m_image.
                                 super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.
                                 m_internal);
  }
  if (resultBuffer.m_allocation.
      super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr !=
      (Allocation *)0x0) {
    (*(resultBuffer.m_allocation.
       super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr)->
      _vptr_Allocation[1])();
    resultBuffer.m_allocation.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.
    m_data.ptr = (Allocation *)0x0;
  }
  if (resultBuffer.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal
      != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)8>_>::operator()
              (&resultBuffer.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter,
               (VkBuffer)
               resultBuffer.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.
               m_internal);
  }
  if (vertexBuffer.m_allocation.
      super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr !=
      (Allocation *)0x0) {
    (*(vertexBuffer.m_allocation.
       super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr)->
      _vptr_Allocation[1])();
    vertexBuffer.m_allocation.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.
    m_data.ptr = (Allocation *)0x0;
  }
  if (vertexBuffer.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal
      != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)8>_>::operator()
              (&vertexBuffer.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter,
               (VkBuffer)
               vertexBuffer.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.
               m_internal);
  }
  return pTVar20;
}

Assistant:

tcu::TestStatus UserDefinedIOTestInstance::iterate (void)
{
	requireFeatures(m_context.getInstanceInterface(), m_context.getPhysicalDevice(), FEATURE_TESSELLATION_SHADER | FEATURE_VERTEX_PIPELINE_STORES_AND_ATOMICS);

	const DeviceInterface&	vk					= m_context.getDeviceInterface();
	const VkDevice			device				= m_context.getDevice();
	const VkQueue			queue				= m_context.getUniversalQueue();
	const deUint32			queueFamilyIndex	= m_context.getUniversalQueueFamilyIndex();
	Allocator&				allocator			= m_context.getDefaultAllocator();

	const int				numAttributes				= NUM_TESS_LEVELS + 2 + 2;
	static const float		attributes[numAttributes]	= { /* inner */ 3.0f, 4.0f, /* outer */ 5.0f, 6.0f, 7.0f, 8.0f, /* pos. scale */ 1.2f, 1.3f, /* pos. offset */ -0.3f, -0.4f };
	const int				refNumVertices				= referenceVertexCount(m_caseDef.primitiveType, SPACINGMODE_EQUAL, false, &attributes[0], &attributes[2]);
	const int				refNumUniqueVertices		= referenceVertexCount(m_caseDef.primitiveType, SPACINGMODE_EQUAL, true, &attributes[0], &attributes[2]);

	// Vertex input attributes buffer: to pass tessellation levels

	const VkFormat     vertexFormat				= VK_FORMAT_R32_SFLOAT;
	const deUint32     vertexStride				= tcu::getPixelSize(mapVkFormat(vertexFormat));
	const VkDeviceSize vertexDataSizeBytes		= numAttributes * vertexStride;
	const Buffer       vertexBuffer				(vk, device, allocator, makeBufferCreateInfo(vertexDataSizeBytes, VK_BUFFER_USAGE_VERTEX_BUFFER_BIT), MemoryRequirement::HostVisible);

	{
		const Allocation& alloc = vertexBuffer.getAllocation();
		deMemcpy(alloc.getHostPtr(), &attributes[0], static_cast<std::size_t>(vertexDataSizeBytes));
		flushMappedMemoryRange(vk, device, alloc.getMemory(), alloc.getOffset(), vertexDataSizeBytes);
	}

	// Output buffer: number of invocations and verification indices

	const int		   resultBufferMaxVertices	= refNumVertices;
	const VkDeviceSize resultBufferSizeBytes    = sizeof(deInt32) + resultBufferMaxVertices * sizeof(deUint32);
	const Buffer       resultBuffer             (vk, device, allocator, makeBufferCreateInfo(resultBufferSizeBytes, VK_BUFFER_USAGE_STORAGE_BUFFER_BIT), MemoryRequirement::HostVisible);

	{
		const Allocation& alloc = resultBuffer.getAllocation();
		deMemset(alloc.getHostPtr(), 0, static_cast<std::size_t>(resultBufferSizeBytes));
		flushMappedMemoryRange(vk, device, alloc.getMemory(), alloc.getOffset(), resultBufferSizeBytes);
	}

	// Color attachment

	const tcu::IVec2			  renderSize				 = tcu::IVec2(RENDER_SIZE, RENDER_SIZE);
	const VkFormat				  colorFormat				 = VK_FORMAT_R8G8B8A8_UNORM;
	const VkImageSubresourceRange colorImageSubresourceRange = makeImageSubresourceRange(VK_IMAGE_ASPECT_COLOR_BIT, 0u, 1u, 0u, 1u);
	const Image					  colorAttachmentImage		 (vk, device, allocator,
															 makeImageCreateInfo(renderSize, colorFormat, VK_IMAGE_USAGE_COLOR_ATTACHMENT_BIT | VK_IMAGE_USAGE_TRANSFER_SRC_BIT, 1u),
															 MemoryRequirement::Any);

	// Color output buffer: image will be copied here for verification

	const VkDeviceSize	colorBufferSizeBytes	= renderSize.x()*renderSize.y() * tcu::getPixelSize(mapVkFormat(colorFormat));
	const Buffer		colorBuffer				(vk, device, allocator, makeBufferCreateInfo(colorBufferSizeBytes, VK_BUFFER_USAGE_TRANSFER_DST_BIT), MemoryRequirement::HostVisible);

	// Descriptors

	const Unique<VkDescriptorSetLayout> descriptorSetLayout(DescriptorSetLayoutBuilder()
		.addSingleBinding(VK_DESCRIPTOR_TYPE_STORAGE_BUFFER, VK_SHADER_STAGE_TESSELLATION_EVALUATION_BIT)
		.build(vk, device));

	const Unique<VkDescriptorPool> descriptorPool(DescriptorPoolBuilder()
		.addType(VK_DESCRIPTOR_TYPE_STORAGE_BUFFER)
		.build(vk, device, VK_DESCRIPTOR_POOL_CREATE_FREE_DESCRIPTOR_SET_BIT, 1u));

	const Unique<VkDescriptorSet> descriptorSet    (makeDescriptorSet(vk, device, *descriptorPool, *descriptorSetLayout));
	const VkDescriptorBufferInfo  resultBufferInfo = makeDescriptorBufferInfo(resultBuffer.get(), 0ull, resultBufferSizeBytes);

	DescriptorSetUpdateBuilder()
		.writeSingle(*descriptorSet, DescriptorSetUpdateBuilder::Location::binding(0u), VK_DESCRIPTOR_TYPE_STORAGE_BUFFER, &resultBufferInfo)
		.update(vk, device);

	// Pipeline

	const Unique<VkImageView>      colorAttachmentView(makeImageView(vk, device, *colorAttachmentImage, VK_IMAGE_VIEW_TYPE_2D, colorFormat, colorImageSubresourceRange));
	const Unique<VkRenderPass>     renderPass         (makeRenderPass(vk, device, colorFormat));
	const Unique<VkFramebuffer>    framebuffer        (makeFramebuffer(vk, device, *renderPass, *colorAttachmentView, renderSize.x(), renderSize.y(), 1u));
	const Unique<VkPipelineLayout> pipelineLayout     (makePipelineLayout(vk, device, *descriptorSetLayout));
	const Unique<VkCommandPool>    cmdPool            (makeCommandPool(vk, device, queueFamilyIndex));
	const Unique<VkCommandBuffer>  cmdBuffer          (allocateCommandBuffer (vk, device, *cmdPool, VK_COMMAND_BUFFER_LEVEL_PRIMARY));

	const Unique<VkPipeline> pipeline(GraphicsPipelineBuilder()
		.setRenderSize                (renderSize)
		.setPatchControlPoints        (numAttributes)
		.setVertexInputSingleAttribute(vertexFormat, vertexStride)
		.setShader                    (vk, device, VK_SHADER_STAGE_VERTEX_BIT,					m_context.getBinaryCollection().get("vert"), DE_NULL)
		.setShader                    (vk, device, VK_SHADER_STAGE_TESSELLATION_CONTROL_BIT,	m_context.getBinaryCollection().get("tesc"), DE_NULL)
		.setShader                    (vk, device, VK_SHADER_STAGE_TESSELLATION_EVALUATION_BIT, m_context.getBinaryCollection().get("tese"), DE_NULL)
		.setShader                    (vk, device, VK_SHADER_STAGE_FRAGMENT_BIT,				m_context.getBinaryCollection().get("frag"), DE_NULL)
		.build                        (vk, device, *pipelineLayout, *renderPass));

	// Begin draw

	beginCommandBuffer(vk, *cmdBuffer);

	// Change color attachment image layout
	{
		const VkImageMemoryBarrier colorAttachmentLayoutBarrier = makeImageMemoryBarrier(
			(VkAccessFlags)0, VK_ACCESS_COLOR_ATTACHMENT_WRITE_BIT,
			VK_IMAGE_LAYOUT_UNDEFINED, VK_IMAGE_LAYOUT_COLOR_ATTACHMENT_OPTIMAL,
			*colorAttachmentImage, colorImageSubresourceRange);

		vk.cmdPipelineBarrier(*cmdBuffer, VK_PIPELINE_STAGE_TOP_OF_PIPE_BIT, VK_PIPELINE_STAGE_FRAGMENT_SHADER_BIT, 0u,
			0u, DE_NULL, 0u, DE_NULL, 1u, &colorAttachmentLayoutBarrier);
	}

	{
		const VkRect2D renderArea = {
			makeOffset2D(0, 0),
			makeExtent2D(renderSize.x(), renderSize.y()),
		};
		const tcu::Vec4 clearColor(0.0f, 0.0f, 0.0f, 1.0f);

		beginRenderPass(vk, *cmdBuffer, *renderPass, *framebuffer, renderArea, clearColor);
	}

	vk.cmdBindPipeline(*cmdBuffer, VK_PIPELINE_BIND_POINT_GRAPHICS, *pipeline);
	vk.cmdBindDescriptorSets(*cmdBuffer, VK_PIPELINE_BIND_POINT_GRAPHICS, *pipelineLayout, 0u, 1u, &descriptorSet.get(), 0u, DE_NULL);
	{
		const VkDeviceSize vertexBufferOffset = 0ull;
		vk.cmdBindVertexBuffers(*cmdBuffer, 0u, 1u, &vertexBuffer.get(), &vertexBufferOffset);
	}

	vk.cmdDraw(*cmdBuffer, numAttributes, 1u, 0u, 0u);
	endRenderPass(vk, *cmdBuffer);

	// Copy render result to a host-visible buffer
	{
		const VkImageMemoryBarrier colorAttachmentPreCopyBarrier = makeImageMemoryBarrier(
			VK_ACCESS_COLOR_ATTACHMENT_WRITE_BIT, VK_ACCESS_TRANSFER_READ_BIT,
			VK_IMAGE_LAYOUT_COLOR_ATTACHMENT_OPTIMAL, VK_IMAGE_LAYOUT_TRANSFER_SRC_OPTIMAL,
			*colorAttachmentImage, colorImageSubresourceRange);

		vk.cmdPipelineBarrier(*cmdBuffer, VK_PIPELINE_STAGE_COLOR_ATTACHMENT_OUTPUT_BIT, VK_PIPELINE_STAGE_TRANSFER_BIT, 0u,
			0u, DE_NULL, 0u, DE_NULL, 1u, &colorAttachmentPreCopyBarrier);
	}
	{
		const VkBufferImageCopy copyRegion = makeBufferImageCopy(makeExtent3D(renderSize.x(), renderSize.y(), 1), makeImageSubresourceLayers(VK_IMAGE_ASPECT_COLOR_BIT, 0u, 0u, 1u));
		vk.cmdCopyImageToBuffer(*cmdBuffer, *colorAttachmentImage, VK_IMAGE_LAYOUT_TRANSFER_SRC_OPTIMAL, *colorBuffer, 1u, &copyRegion);
	}
	{
		const VkBufferMemoryBarrier postCopyBarrier = makeBufferMemoryBarrier(
			VK_ACCESS_TRANSFER_WRITE_BIT, VK_ACCESS_HOST_READ_BIT, *colorBuffer, 0ull, colorBufferSizeBytes);

		vk.cmdPipelineBarrier(*cmdBuffer, VK_PIPELINE_STAGE_TRANSFER_BIT, VK_PIPELINE_STAGE_HOST_BIT, 0u,
			0u, DE_NULL, 1u, &postCopyBarrier, 0u, DE_NULL);
	}

	endCommandBuffer(vk, *cmdBuffer);
	submitCommandsAndWait(vk, device, queue, *cmdBuffer);

	// Verification

	bool isImageCompareOK = false;
	{
		const Allocation& colorBufferAlloc = colorBuffer.getAllocation();
		invalidateMappedMemoryRange(vk, device, colorBufferAlloc.getMemory(), colorBufferAlloc.getOffset(), colorBufferSizeBytes);

		// Load reference image
		tcu::TextureLevel referenceImage;
		tcu::ImageIO::loadPNG(referenceImage, m_context.getTestContext().getArchive(), m_caseDef.referenceImagePath.c_str());

		// Verify case result
		const tcu::ConstPixelBufferAccess resultImageAccess(mapVkFormat(colorFormat), renderSize.x(), renderSize.y(), 1, colorBufferAlloc.getHostPtr());
		isImageCompareOK = tcu::fuzzyCompare(m_context.getTestContext().getLog(), "ImageComparison", "Image Comparison",
											 referenceImage.getAccess(), resultImageAccess, 0.02f, tcu::COMPARE_LOG_RESULT);
	}
	{
		const Allocation& resultAlloc = resultBuffer.getAllocation();
		invalidateMappedMemoryRange(vk, device, resultAlloc.getMemory(), resultAlloc.getOffset(), resultBufferSizeBytes);

		const deInt32			numVertices = *static_cast<deInt32*>(resultAlloc.getHostPtr());
		const deUint32* const	vertices    = reinterpret_cast<deUint32*>(static_cast<deUint8*>(resultAlloc.getHostPtr()) + sizeof(deInt32));

		// If this fails then we didn't read all vertices from shader and test must be changed to allow more.
		DE_ASSERT(numVertices <= refNumVertices);

		if (numVertices < refNumUniqueVertices)
		{
			m_context.getTestContext().getLog()
				<< tcu::TestLog::Message << "Failure: got " << numVertices << " vertices, but expected at least " << refNumUniqueVertices << tcu::TestLog::EndMessage;

			return tcu::TestStatus::fail("Wrong number of vertices");
		}
		else
		{
			tcu::TestLog&	log					= m_context.getTestContext().getLog();
			const int		topLevelArraySize	= (m_caseDef.ioType == IO_TYPE_PER_PATCH			? 1
												: m_caseDef.ioType == IO_TYPE_PER_PATCH_ARRAY		? NUM_PER_PATCH_ARRAY_ELEMS
												: m_caseDef.ioType == IO_TYPE_PER_PATCH_BLOCK		? 1
												: m_caseDef.ioType == IO_TYPE_PER_PATCH_BLOCK_ARRAY	? NUM_PER_PATCH_BLOCKS
												: NUM_OUTPUT_VERTICES);
			const deUint32	numTEInputs			= numBasicSubobjectsInElementType(m_tesInputs) * topLevelArraySize;

			for (int vertexNdx = 0; vertexNdx < numVertices; ++vertexNdx)
				if (vertices[vertexNdx] > numTEInputs)
				{
					log << tcu::TestLog::Message
						<< "Failure: out_te_firstFailedInputIndex has value " << vertices[vertexNdx]
						<< ", but should be in range [0, " << numTEInputs << "]" << tcu::TestLog::EndMessage;

					return tcu::TestStatus::fail("Invalid values returned from shader");
				}
				else if (vertices[vertexNdx] != numTEInputs)
				{
					log << tcu::TestLog::Message << "Failure: in tessellation evaluation shader, check for input "
						<< basicSubobjectAtIndex(vertices[vertexNdx], m_tesInputs, topLevelArraySize) << " failed" << tcu::TestLog::EndMessage;

					return tcu::TestStatus::fail("Invalid input value in tessellation evaluation shader");
				}
		}
	}
	return (isImageCompareOK ? tcu::TestStatus::pass("OK") : tcu::TestStatus::fail("Image comparison failed"));
}